

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddFile<google::protobuf::FileDescriptorProto>
          (DescriptorIndex *this,FileDescriptorProto *file,Value value)

{
  String *__return_storage_ptr__;
  int iVar1;
  Rep *pRVar2;
  DescriptorProto *message_type;
  FieldDescriptorProto *field;
  bool bVar3;
  bool bVar4;
  LogMessage *pLVar5;
  size_type extraout_RDX;
  void **ppvVar6;
  long lVar7;
  pair<std::_Rb_tree_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_bool>
  pVar8;
  StringPiece name;
  LogFinisher local_101;
  void **local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  StringPiece local_c0;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  
  local_f8._0_8_ = value.first;
  local_f8._8_4_ = value.second;
  local_e8._0_8_ = &local_d8;
  local_e8._8_8_ = 0;
  local_d8._M_local_buf[0] = '\0';
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::emplace_back<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>
            (&this->all_values_,(EncodedEntry *)local_f8);
  std::__cxx11::string::~string((string *)local_e8);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  name.length_ = extraout_RDX;
  name.ptr_ = (char *)local_40.length_;
  bVar3 = anon_unknown_31::ValidateSymbolName((anon_unknown_31 *)local_40.ptr_,name);
  if (bVar3) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    EncodeString_abi_cxx11_((String *)local_f8,this,local_50);
    std::__cxx11::string::operator=
              ((string *)
               &(this->all_values_).
                super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].encoded_package,(string *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._0_4_ =
         (int)(((long)(this->all_values_).
                      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->all_values_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) + -1;
    __return_storage_ptr__ = (String *)(local_f8 + 8);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    EncodeString_abi_cxx11_(__return_storage_ptr__,this,local_60);
    pVar8 = std::
            _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>
            ::
            _M_insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&>
                      ((_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>
                        *)&this->by_name_,(FileEntry *)local_f8);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    else {
      bVar3 = std::
              binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::__cxx11::string,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                        ((this->by_name_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->by_name_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                         (this->by_name_)._M_t._M_impl.
                         super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                         ._M_key_compare.index);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      if (!bVar3) {
        pRVar2 = (file->message_type_).super_RepeatedPtrFieldBase.rep_;
        ppvVar6 = pRVar2->elements;
        if (pRVar2 == (Rep *)0x0) {
          ppvVar6 = (void **)0x0;
        }
        iVar1 = (file->message_type_).super_RepeatedPtrFieldBase.current_size_;
        lVar7 = 0;
        while( true ) {
          if ((long)iVar1 * 8 == lVar7) {
            pRVar2 = (file->enum_type_).super_RepeatedPtrFieldBase.rep_;
            ppvVar6 = pRVar2->elements;
            if (pRVar2 == (Rep *)0x0) {
              ppvVar6 = (void **)0x0;
            }
            iVar1 = (file->enum_type_).super_RepeatedPtrFieldBase.current_size_;
            lVar7 = 0;
            while ((long)iVar1 * 8 != lVar7) {
              stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                        (&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(ulong *)(*(long *)((long)ppvVar6 + lVar7) + 0x60) & 0xfffffffffffffffe))
              ;
              bVar3 = AddSymbol(this,local_90);
              lVar7 = lVar7 + 8;
              if (!bVar3) {
                return false;
              }
            }
            pRVar2 = (file->extension_).super_RepeatedPtrFieldBase.rep_;
            local_100 = pRVar2->elements;
            if (pRVar2 == (Rep *)0x0) {
              local_100 = (void **)0x0;
            }
            iVar1 = (file->extension_).super_RepeatedPtrFieldBase.current_size_;
            lVar7 = 0;
            while( true ) {
              if ((long)iVar1 * 8 == lVar7) {
                pRVar2 = (file->service_).super_RepeatedPtrFieldBase.rep_;
                ppvVar6 = pRVar2->elements;
                if (pRVar2 == (Rep *)0x0) {
                  ppvVar6 = (void **)0x0;
                }
                iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
                lVar7 = 0;
                do {
                  bVar3 = (long)iVar1 * 8 == lVar7;
                  if (bVar3) {
                    return bVar3;
                  }
                  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                            (&local_c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (*(ulong *)(*(long *)((long)ppvVar6 + lVar7) + 0x30) &
                             0xfffffffffffffffe));
                  bVar4 = AddSymbol(this,local_c0);
                  lVar7 = lVar7 + 8;
                } while (bVar4);
                return bVar3;
              }
              field = *(FieldDescriptorProto **)((long)local_100 + lVar7);
              stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                        (&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              bVar3 = AddSymbol(this,local_a0);
              if (!bVar3) break;
              stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                        (&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              bVar3 = AddExtension<google::protobuf::FieldDescriptorProto>(this,local_b0,field);
              lVar7 = lVar7 + 8;
              if (!bVar3) {
                return false;
              }
            }
            return false;
          }
          message_type = *(DescriptorProto **)((long)ppvVar6 + lVar7);
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(message_type->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          bVar3 = AddSymbol(this,local_70);
          if (!bVar3) break;
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          bVar3 = AddNestedExtensions<google::protobuf::DescriptorProto>(this,local_80,message_type)
          ;
          lVar7 = lVar7 + 8;
          if (!bVar3) {
            return false;
          }
        }
        return false;
      }
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_f8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x281);
    pLVar5 = internal::LogMessage::operator<<
                       ((LogMessage *)local_f8,"File already exists in database: ");
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,(string *)
                               ((ulong)(file->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    internal::LogFinisher::operator=(&local_101,pLVar5);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_f8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x277);
    pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_f8,"Invalid package name: ");
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,(string *)
                               ((ulong)(file->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    internal::LogFinisher::operator=(&local_101,pLVar5);
  }
  internal::LogMessage::~LogMessage((LogMessage *)local_f8);
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddFile(const FileProto& file,
                                                         Value value) {
  // We push `value` into the array first. This is important because the AddXXX
  // functions below will expect it to be there.
  all_values_.push_back({value.first, value.second, {}});

  if (!ValidateSymbolName(file.package())) {
    GOOGLE_LOG(ERROR) << "Invalid package name: " << file.package();
    return false;
  }
  all_values_.back().encoded_package = EncodeString(file.package());

  if (!InsertIfNotPresent(
          &by_name_, FileEntry{static_cast<int>(all_values_.size() - 1),
                               EncodeString(file.name())}) ||
      std::binary_search(by_name_flat_.begin(), by_name_flat_.end(),
                         file.name(), by_name_.key_comp())) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  for (const auto& message_type : file.message_type()) {
    if (!AddSymbol(message_type.name())) return false;
    if (!AddNestedExtensions(file.name(), message_type)) return false;
  }
  for (const auto& enum_type : file.enum_type()) {
    if (!AddSymbol(enum_type.name())) return false;
  }
  for (const auto& extension : file.extension()) {
    if (!AddSymbol(extension.name())) return false;
    if (!AddExtension(file.name(), extension)) return false;
  }
  for (const auto& service : file.service()) {
    if (!AddSymbol(service.name())) return false;
  }

  return true;
}